

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoCore.c
# Opt level: O2

void reoReorderArray(reo_man *p,DdManager *dd,DdNode **Funcs,DdNode **FuncsRes,int nFuncs,
                    int *pOrder)

{
  double dVar1;
  double dVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  reo_unit *prVar6;
  DdNode *pDVar7;
  ulong uVar8;
  reo_unit **pprVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  
  p->dd = dd;
  p->pOrder = pOrder;
  p->nTops = nFuncs;
  iVar4 = Cudd_SharingSize(Funcs,nFuncs);
  p->nNodesBeg = iVar4;
  iVar10 = dd->size;
  if (dd->size < dd->sizeZ) {
    iVar10 = dd->sizeZ;
  }
  reoResizeStructures(p,iVar10,iVar4,nFuncs);
  piVar5 = Extra_VectorSupportArray(dd,Funcs,nFuncs,p->pSupp);
  p->pSupp = piVar5;
  p->nSupp = 0;
  uVar12 = dd->size;
  iVar10 = 0;
  uVar13 = 0;
  if (0 < (int)uVar12) {
    uVar13 = (ulong)uVar12;
  }
  for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    iVar10 = iVar10 + piVar5[uVar14];
    p->nSupp = iVar10;
  }
  if (iVar10 == 0) {
    uVar14 = 0;
    uVar13 = (ulong)(uint)nFuncs;
    if (nFuncs < 1) {
      uVar13 = uVar14;
    }
    for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      pDVar7 = Funcs[uVar14];
      FuncsRes[uVar14] = pDVar7;
      Cudd_Ref(pDVar7);
    }
    return;
  }
  iVar10 = 0;
  for (lVar11 = 0; lVar11 < (int)uVar12; lVar11 = lVar11 + 1) {
    piVar3 = dd->invperm;
    if (piVar5[piVar3[lVar11]] != 0) {
      p->pMapToPlanes[piVar3[lVar11]] = iVar10;
      iVar4 = piVar3[lVar11];
      p->pMapToDdVarsOrig[iVar10] = iVar4;
      if (p->fRemapUp != 0) {
        iVar4 = piVar3[iVar10];
      }
      p->pMapToDdVarsFinal[iVar10] = iVar4;
      p->pOrderInt[iVar10] = iVar10;
      iVar10 = iVar10 + 1;
      uVar12 = dd->size;
    }
  }
  p->nUnitsUsed = 0;
  p->nNodesCur = 0;
  p->fThisIsAdd = 0;
  p->Signature = p->Signature + 1;
  uVar14 = 0;
  uVar13 = (ulong)(uint)nFuncs;
  if (nFuncs < 1) {
    uVar13 = uVar14;
  }
  for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    prVar6 = reoTransferNodesToUnits_rec(p,Funcs[uVar14]);
    p->pTops[uVar14] = prVar6;
  }
  if (p->nNodesBeg != p->nNodesCur) {
    __assert_fail("p->nNodesBeg == p->nNodesCur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                  ,0x67,
                  "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)");
  }
  if (p->fThisIsAdd == 0) {
    if (p->fMinWidth != 0) {
      puts("An important message from the REO reordering engine:");
      puts("The BDD given to the engine for reordering contains complemented edges.");
      puts("Currently, such BDDs cannot be reordered for the minimum width.");
      puts("Therefore, minimization for the number of BDD nodes is performed.");
      fflush(_stdout);
      p->fMinWidth = 0;
      p->fMinApl = 0;
    }
LAB_0067ccb5:
    if (p->fMinApl == 0) {
      reoProfileNodesStart(p);
    }
    else {
      reoProfileAplStart(p);
    }
  }
  else {
    if (p->fMinWidth == 0) goto LAB_0067ccb5;
    reoProfileWidthStart(p);
  }
  if (p->fVerbose != 0) {
    puts("INITIAL:");
    if (p->fMinWidth == 0) {
      if (p->fMinApl == 0) {
        reoProfileNodesPrint(p);
      }
      else {
        reoProfileAplPrint(p);
      }
    }
    else {
      reoProfileWidthPrint(p);
    }
  }
  p->nSwaps = 0;
  p->nNISwaps = 0;
  for (uVar12 = 1; (int)(uVar12 - 1) < p->nIters; uVar12 = uVar12 + 1) {
    reoReorderSift(p);
    if (p->fVerbose != 0) {
      printf("ITER #%d:\n",(ulong)uVar12);
      if (p->fMinWidth == 0) {
        if (p->fMinApl == 0) {
          reoProfileNodesPrint(p);
        }
        else {
          reoProfileAplPrint(p);
        }
      }
      else {
        reoProfileWidthPrint(p);
      }
    }
    if (p->fMinWidth == 0) {
      if (p->fMinApl == 0) {
        iVar10 = p->nNodesCur;
        p->nNodesEnd = iVar10;
        bVar16 = iVar10 == p->nNodesBeg;
        if (p->nNodesBeg < iVar10) {
          __assert_fail("p->nNodesEnd <= p->nNodesBeg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                        ,0xaa,
                        "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                       );
        }
        goto LAB_0067cd80;
      }
      dVar1 = p->nAplCur;
      dVar2 = p->nAplBeg;
      p->nAplEnd = dVar1;
      if (dVar2 < dVar1) {
        __assert_fail("p->nAplEnd <= p->nAplBeg",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                      ,0xa3,
                      "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                     );
      }
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) break;
    }
    else {
      iVar10 = p->nWidthCur;
      p->nWidthEnd = iVar10;
      bVar16 = iVar10 == p->nWidthBeg;
      if (!bVar16 && p->nWidthBeg <= iVar10) {
        __assert_fail("p->nWidthEnd <= p->nWidthBeg",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                      ,0x9c,
                      "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                     );
      }
LAB_0067cd80:
      if (bVar16) break;
    }
  }
  uVar8 = 0;
  uVar14 = (ulong)(uint)p->nSupp;
  if (p->nSupp < 1) {
    uVar14 = uVar8;
  }
  for (; uVar8 != uVar14; uVar8 = uVar8 + 1) {
    if (p->pPlanes[uVar8].statsNodes == 0) {
      __assert_fail("p->pPlanes[i].statsNodes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                    ,0x1aa,"int reoCheckLevels(reo_man *)");
    }
    pprVar9 = &p->pPlanes[uVar8].pHead;
    while (prVar6 = *pprVar9, prVar6 != (reo_unit *)0x0) {
      pprVar9 = &prVar6->Next;
      if (uVar8 != (uint)(int)prVar6->lev) {
        __assert_fail("pUnit->lev == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                      ,0x1ae,"int reoCheckLevels(reo_man *)");
      }
    }
  }
  s_AplBefore = p->nAplBeg;
  s_AplAfter = p->nAplEnd;
  p->nRefNodes = 0;
  p->nNodesCur = 0;
  p->Signature = p->Signature + 1;
  for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    pDVar7 = reoTransferUnitsToNodes_rec(p,p->pTops[uVar14]);
    FuncsRes[uVar14] = pDVar7;
    Cudd_Ref(pDVar7);
  }
  for (lVar11 = 0; lVar11 < p->nRefNodes; lVar11 = lVar11 + 1) {
    Cudd_RecursiveDeref(dd,p->pRefNodes[lVar11]);
  }
  for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    reoRecursiveDeref(p->pTops[uVar14]);
  }
  uVar12 = p->nSupp;
  pprVar9 = &p->pPlanes[(int)uVar12].pHead;
  while (prVar6 = *pprVar9, prVar6 != (reo_unit *)0x0) {
    pprVar9 = &prVar6->Next;
    if (prVar6->n != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                    ,0x191,"int reoCheckZeroRefs(reo_plane *)");
    }
  }
  piVar5 = p->pOrder;
  if (piVar5 == (int *)0x0) {
    if (p->fVerify == 0) goto LAB_0067d06a;
    piVar5 = (int *)malloc((long)(int)uVar12 * 4);
    uVar8 = 0;
    uVar14 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar14 = uVar8;
    }
    for (; uVar14 != uVar8; uVar8 = uVar8 + 1) {
      piVar5[p->pMapToDdVarsFinal[uVar8]] = p->pMapToDdVarsOrig[p->pOrderInt[uVar8]];
    }
  }
  else {
    for (lVar11 = 0; lVar11 < (int)uVar12; lVar11 = lVar11 + 1) {
      piVar5[p->pMapToDdVarsFinal[lVar11]] = p->pMapToDdVarsOrig[p->pOrderInt[lVar11]];
      uVar12 = p->nSupp;
    }
    if (p->fVerify == 0) goto LAB_0067d06a;
  }
  bVar16 = true;
  for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    if (p->fThisIsAdd == 0) {
      pDVar7 = Cudd_bddPermute(dd,FuncsRes[uVar14],piVar5);
    }
    else {
      pDVar7 = Cudd_addPermute(dd,FuncsRes[uVar14],piVar5);
    }
    Cudd_Ref(pDVar7);
    if (pDVar7 != Funcs[uVar14]) {
      puts("REO: Internal verification has failed!");
      fflush(_stdout);
      bVar16 = false;
    }
    Cudd_RecursiveDeref(dd,pDVar7);
  }
  if (bVar16) {
    puts("REO: Internal verification is okay!");
  }
  if ((piVar5 != (int *)0x0) && (p->pOrder == (int *)0x0)) {
    free(piVar5);
  }
LAB_0067d06a:
  lVar11 = 0;
  for (lVar15 = 0; lVar15 <= p->nSupp; lVar15 = lVar15 + 1) {
    reoUnitsRecycleUnitList(p,(reo_plane *)((long)&p->pPlanes->fSifted + lVar11));
    lVar11 = lVar11 + 0x38;
  }
  return;
}

Assistant:

void reoReorderArray( reo_man * p, DdManager * dd, DdNode * Funcs[], DdNode * FuncsRes[], int nFuncs, int * pOrder )
{
    int Counter, i;

    // set the initial parameters
    p->dd     = dd;
    p->pOrder = pOrder;
    p->nTops  = nFuncs;
    // get the initial number of nodes
    p->nNodesBeg = Cudd_SharingSize( Funcs, nFuncs );     
    // resize the internal data structures of the manager if necessary
    reoResizeStructures( p, ddMax(dd->size,dd->sizeZ), p->nNodesBeg, nFuncs );
    // compute the support
    p->pSupp = Extra_VectorSupportArray( dd, Funcs, nFuncs, p->pSupp );
    // get the number of support variables
    p->nSupp = 0;
    for ( i = 0; i < dd->size; i++ )
        p->nSupp += p->pSupp[i];

    // if it is the constant function, no need to reorder
    if ( p->nSupp == 0 )
    {
        for ( i = 0; i < nFuncs; i++ )
        {
            FuncsRes[i] = Funcs[i]; Cudd_Ref( FuncsRes[i] );
        }
        return;
    }

    // create the internal variable maps
    // go through variable levels in the manager
    Counter = 0;
    for ( i = 0; i < dd->size; i++ )
        if ( p->pSupp[ dd->invperm[i] ] )
        {
            p->pMapToPlanes[ dd->invperm[i] ] = Counter;
            p->pMapToDdVarsOrig[Counter]      = dd->invperm[i];
            if ( !p->fRemapUp )
                p->pMapToDdVarsFinal[Counter] = dd->invperm[i];
            else
                p->pMapToDdVarsFinal[Counter] = dd->invperm[Counter];
            p->pOrderInt[Counter]        = Counter;
            Counter++;
        }

    // set the initial parameters
    p->nUnitsUsed = 0;
    p->nNodesCur  = 0;
    p->fThisIsAdd = 0;
    p->Signature++;
    // transfer the function from the CUDD package into REO"s internal data structure
    for ( i = 0; i < nFuncs; i++ )
        p->pTops[i] = reoTransferNodesToUnits_rec( p, Funcs[i] );
    assert( p->nNodesBeg == p->nNodesCur );

    if ( !p->fThisIsAdd && p->fMinWidth )
    {
        printf( "An important message from the REO reordering engine:\n" );
        printf( "The BDD given to the engine for reordering contains complemented edges.\n" );
        printf( "Currently, such BDDs cannot be reordered for the minimum width.\n" );
        printf( "Therefore, minimization for the number of BDD nodes is performed.\n" );
        fflush( stdout );
        p->fMinApl   = 0;
        p->fMinWidth = 0;
    }

    if ( p->fMinWidth )
        reoProfileWidthStart(p);
    else if ( p->fMinApl )
        reoProfileAplStart(p);
    else 
        reoProfileNodesStart(p);

    if ( p->fVerbose )
    {
        printf( "INITIAL:\n" );
        if ( p->fMinWidth )
            reoProfileWidthPrint(p);
        else if ( p->fMinApl )
            reoProfileAplPrint(p);
        else
            reoProfileNodesPrint(p);
    }
 
    ///////////////////////////////////////////////////////////////////
    // performs the reordering
    p->nSwaps   = 0;
    p->nNISwaps = 0;
    for ( i = 0; i < p->nIters; i++ )
    {
        reoReorderSift( p );
        // print statistics after each iteration
        if ( p->fVerbose )
        {
            printf( "ITER #%d:\n", i+1 );
            if ( p->fMinWidth )
                reoProfileWidthPrint(p);
            else if ( p->fMinApl )
                reoProfileAplPrint(p);
            else
                reoProfileNodesPrint(p);
        }
        // if the cost function did not change, stop iterating
        if ( p->fMinWidth )
        {
            p->nWidthEnd = p->nWidthCur;
            assert( p->nWidthEnd <= p->nWidthBeg );
            if ( p->nWidthEnd == p->nWidthBeg )
                break;
        }
        else if ( p->fMinApl )
        {
            p->nAplEnd = p->nAplCur;
            assert( p->nAplEnd <= p->nAplBeg );
            if ( p->nAplEnd == p->nAplBeg )
                break;
        }
        else
        {
            p->nNodesEnd = p->nNodesCur;
            assert( p->nNodesEnd <= p->nNodesBeg );
            if ( p->nNodesEnd == p->nNodesBeg )
                break;
        }
    }
    assert( reoCheckLevels( p ) );
    ///////////////////////////////////////////////////////////////////

s_AplBefore = p->nAplBeg;
s_AplAfter  = p->nAplEnd;

    // set the initial parameters
    p->nRefNodes  = 0;
    p->nNodesCur  = 0;
    p->Signature++;
    // transfer the BDDs from REO's internal data structure to CUDD
    for ( i = 0; i < nFuncs; i++ )
    {
        FuncsRes[i] = reoTransferUnitsToNodes_rec( p, p->pTops[i] ); Cudd_Ref( FuncsRes[i] );
    }
    // undo the DDs referenced for storing in the cache
    for ( i = 0; i < p->nRefNodes; i++ )
        Cudd_RecursiveDeref( dd, p->pRefNodes[i] );
    // verify zero refs of the terminal nodes
    for ( i = 0; i < nFuncs; i++ )
    {
        assert( reoRecursiveDeref( p->pTops[i] ) );
    }
    assert( reoCheckZeroRefs( &(p->pPlanes[p->nSupp]) ) );

    // prepare the variable map to return to the user
    if ( p->pOrder )
    {
        // i is the current level in the planes data structure
        // p->pOrderInt[i] is the original level in the planes data structure
        // p->pMapToDdVarsOrig[i] is the variable, into which we remap when we construct the BDD from planes
        // p->pMapToDdVarsOrig[ p->pOrderInt[i] ] is the original BDD variable corresponding to this level
        // Therefore, p->pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]
        // creates the permutation, which remaps the resulting BDD variable into the original BDD variable
        for ( i = 0; i < p->nSupp; i++ )
            p->pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]; 
    }

    if ( p->fVerify )
    {
        int fVerification;
        DdNode * FuncRemapped;
        int * pOrder;

        if ( p->pOrder == NULL )
        {
            pOrder = ABC_ALLOC( int, p->nSupp );
            for ( i = 0; i < p->nSupp; i++ )
                pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]; 
        }
        else
            pOrder = p->pOrder;

        fVerification = 1;
        for ( i = 0; i < nFuncs; i++ )
        {
            // verify the result
            if ( p->fThisIsAdd )
                FuncRemapped = Cudd_addPermute( dd, FuncsRes[i], pOrder );
            else
                FuncRemapped = Cudd_bddPermute( dd, FuncsRes[i], pOrder );
            Cudd_Ref( FuncRemapped );

            if ( FuncRemapped != Funcs[i] )
            {
                fVerification = 0;
                printf( "REO: Internal verification has failed!\n" );
                fflush( stdout );
            }
            Cudd_RecursiveDeref( dd, FuncRemapped );
        }
        if ( fVerification )
            printf( "REO: Internal verification is okay!\n" );

        if ( p->pOrder == NULL )
            ABC_FREE( pOrder );
    }

    // recycle the data structure
    for ( i = 0; i <= p->nSupp; i++ )
        reoUnitsRecycleUnitList( p, p->pPlanes + i );
}